

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O3

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalBatchCopyToFile::GetLocalSinkState
          (PhysicalBatchCopyToFile *this,ExecutionContext *context)

{
  ThreadContext *pTVar1;
  _func_int **pp_Var2;
  _func_int *local_20;
  
  pTVar1 = context[9].thread;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator*
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             (context + 0x22));
  (*(code *)pTVar1)(&local_20);
  pp_Var2 = (_func_int **)operator_new(0xb8);
  *(undefined4 *)(pp_Var2 + 1) = 0xffffffff;
  *(undefined4 *)((long)pp_Var2 + 0xc) = 0xffffffff;
  *(undefined4 *)(pp_Var2 + 2) = 0xffffffff;
  *(undefined4 *)((long)pp_Var2 + 0x14) = 0xffffffff;
  *(undefined1 (*) [16])(pp_Var2 + 3) = (undefined1  [16])0x0;
  pp_Var2[5] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__FixedBatchCopyLocalState_0246cb98;
  pp_Var2[6] = local_20;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[8] = (_func_int *)(pp_Var2 + 0xe);
  pp_Var2[9] = (_func_int *)0x1;
  *(undefined1 (*) [16])(pp_Var2 + 10) = (undefined1  [16])0x0;
  *(undefined4 *)(pp_Var2 + 0xc) = 0x3f800000;
  *(undefined1 (*) [16])(pp_Var2 + 0xd) = (undefined1  [16])0x0;
  *(undefined1 *)(pp_Var2 + 0xf) = 0;
  *(undefined1 (*) [16])(pp_Var2 + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pp_Var2 + 0x12) = (undefined1  [16])0x0;
  pp_Var2[0x14] = (_func_int *)0x0;
  pp_Var2[0x15] = (_func_int *)0xffffffffffffffff;
  *(undefined1 *)(pp_Var2 + 0x16) = 1;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var2;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalBatchCopyToFile::GetLocalSinkState(ExecutionContext &context) const {
	return make_uniq<FixedBatchCopyLocalState>(function.copy_to_initialize_local(context, *bind_data));
}